

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_packet_read(LIBSSH2_SFTP *sftp)

{
  uchar uVar1;
  LIBSSH2_CHANNEL *channel_00;
  LIBSSH2_SESSION *session_00;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  ssize_t sVar5;
  unsigned_long uVar6;
  libssh2_nonblocking_states lVar7;
  uint32_t request_id;
  int packet_type;
  unsigned_long recv_window;
  ssize_t rc;
  uchar *packet;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp_local;
  
  channel_00 = sftp->channel;
  session_00 = channel_00->session;
  rc = 0;
  if (sftp->packet_state == libssh2_NB_state_sent) {
    sftp->packet_state = libssh2_NB_state_idle;
    rc = (ssize_t)sftp->partial_packet;
  }
  else {
    if (sftp->packet_state == libssh2_NB_state_sent1) {
      sftp->packet_state = libssh2_NB_state_idle;
      rc = (ssize_t)sftp->partial_packet;
    }
    if (rc != 0) goto LAB_0013c864;
    sVar5 = _libssh2_channel_read
                      (channel_00,0,(char *)(sftp->packet_header + sftp->packet_header_len),
                       9 - sftp->packet_header_len);
    if (sVar5 == -0x25) {
      return (int)sVar5;
    }
    if (sVar5 < 0) {
      iVar2 = _libssh2_error(session_00,(int)sVar5,"channel read");
      return iVar2;
    }
    sftp->packet_header_len = sVar5 + sftp->packet_header_len;
    if (sftp->packet_header_len != 9) {
      return -0x25;
    }
    uVar3 = _libssh2_ntohu32(sftp->packet_header);
    sftp->partial_len = uVar3;
    uVar1 = sftp->packet_header[4];
    uVar3 = _libssh2_ntohu32(sftp->packet_header + 5);
    if ((0x40000 < sftp->partial_len) &&
       (((sftp->readdir_state == libssh2_NB_state_idle || (sftp->readdir_request_id != uVar3)) ||
        (uVar1 != 'h')))) {
      libssh2_channel_flush_ex(channel_00,0);
      sftp->packet_header_len = 0;
      iVar2 = _libssh2_error(session_00,-0x19,"SFTP packet too large");
      return iVar2;
    }
    if (sftp->partial_len < 5) {
      iVar2 = _libssh2_error(session_00,-6,"Invalid SFTP packet size");
      return iVar2;
    }
    rc = (ssize_t)(*session_00->alloc)((size_t)sftp->partial_len,&session_00->abstract);
    if ((uchar *)rc == (uchar *)0x0) {
      iVar2 = _libssh2_error(session_00,-6,"Unable to allocate SFTP packet");
      return iVar2;
    }
    sftp->packet_header_len = 0;
    sftp->partial_packet = (uchar *)rc;
    sftp->partial_received = 5;
    *(undefined4 *)rc = *(undefined4 *)(sftp->packet_header + 4);
    *(uchar *)(rc + 4) = sftp->packet_header[8];
  }
  uVar6 = libssh2_channel_window_read_ex(channel_00,(unsigned_long *)0x0,(unsigned_long *)0x0);
  if (uVar6 < sftp->partial_len) {
    iVar2 = _libssh2_channel_receive_window_adjust
                      (channel_00,sftp->partial_len << 1,'\x01',(uint *)0x0);
    lVar7 = libssh2_NB_state_idle;
    if (iVar2 == -0x25) {
      lVar7 = libssh2_NB_state_sent;
    }
    sftp->packet_state = lVar7;
    if (iVar2 == -0x25) {
      return -0x25;
    }
  }
LAB_0013c864:
  while( true ) {
    if ((ulong)sftp->partial_len <= sftp->partial_received) {
      sftp->partial_packet = (uchar *)0x0;
      sftp_local._4_4_ = (uint)*(byte *)rc;
      uVar4 = sftp_packet_add(sftp,(uchar *)rc,(ulong)sftp->partial_len);
      if (uVar4 != 0) {
        (*session_00->free)((void *)rc,&session_00->abstract);
        sftp_local._4_4_ = uVar4;
      }
      return sftp_local._4_4_;
    }
    sVar5 = _libssh2_channel_read
                      (channel_00,0,(char *)(rc + sftp->partial_received),
                       (ulong)sftp->partial_len - sftp->partial_received);
    if (sVar5 == -0x25) break;
    if (sVar5 < 0) {
      (*session_00->free)((void *)rc,&session_00->abstract);
      sftp->partial_packet = (uchar *)0x0;
      iVar2 = _libssh2_error(session_00,(int)sVar5,"Error waiting for SFTP packet");
      return iVar2;
    }
    sftp->partial_received = sVar5 + sftp->partial_received;
  }
  sftp->packet_state = libssh2_NB_state_sent1;
  return (int)sVar5;
}

Assistant:

static int
sftp_packet_read(LIBSSH2_SFTP *sftp)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *packet = NULL;
    ssize_t rc;
    unsigned long recv_window;
    int packet_type;
    uint32_t request_id;

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "recv packet"));

    switch(sftp->packet_state) {
    case libssh2_NB_state_sent: /* EAGAIN from window adjusting */
        sftp->packet_state = libssh2_NB_state_idle;

        packet = sftp->partial_packet;
        goto window_adjust;

    case libssh2_NB_state_sent1: /* EAGAIN from channel read */
        sftp->packet_state = libssh2_NB_state_idle;

        packet = sftp->partial_packet;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "partial read cont, len: %u", sftp->partial_len));
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "partial read cont, already recvd: %lu",
                       (unsigned long)sftp->partial_received));
        LIBSSH2_FALLTHROUGH();
    default:
        if(!packet) {
            /* only do this if there's not already a packet buffer allocated
               to use */

            /* each packet starts with a 32 bit length field */
            rc = _libssh2_channel_read(channel, 0,
                                       (char *)&sftp->packet_header[
                                           sftp->packet_header_len],
                                       sizeof(sftp->packet_header) -
                                       sftp->packet_header_len);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return (int)rc;
            else if(rc < 0)
                return _libssh2_error(session, (int)rc, "channel read");

            sftp->packet_header_len += rc;

            if(sftp->packet_header_len != sizeof(sftp->packet_header))
                /* we got a short read for the header part */
                return LIBSSH2_ERROR_EAGAIN;

            /* parse SFTP packet header */
            sftp->partial_len = _libssh2_ntohu32(sftp->packet_header);
            packet_type = sftp->packet_header[4];
            request_id = _libssh2_ntohu32(sftp->packet_header + 5);

            /* make sure we don't proceed if the packet size is unreasonably
               large */
            if(sftp->partial_len > LIBSSH2_SFTP_PACKET_MAXLEN &&
               /* exception: response to SSH_FXP_READDIR request */
               !(sftp->readdir_state != libssh2_NB_state_idle &&
                 sftp->readdir_request_id == request_id &&
                 packet_type == SSH_FXP_NAME)) {
                libssh2_channel_flush(channel);
                sftp->packet_header_len = 0;
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_CHANNEL_PACKET_EXCEEDED,
                                      "SFTP packet too large");
            }

            if(sftp->partial_len < 5)
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_ALLOC,
                                      "Invalid SFTP packet size");

            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "Data begin - Packet Length: %lu",
                           (unsigned long)sftp->partial_len));
            packet = LIBSSH2_ALLOC(session, sftp->partial_len);
            if(!packet)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "Unable to allocate SFTP packet");
            sftp->packet_header_len = 0;
            sftp->partial_packet = packet;
            /* copy over packet type(4) and request id(1) */
            sftp->partial_received = 5;
            memcpy(packet, sftp->packet_header + 4, 5);

window_adjust:
            recv_window = libssh2_channel_window_read_ex(channel, NULL, NULL);

            if(sftp->partial_len > recv_window) {
                /* ask for twice the data amount we need at once */
                rc = _libssh2_channel_receive_window_adjust(channel,
                                                            sftp->partial_len
                                                            * 2,
                                                            1, NULL);
                /* store the state so that we continue with the correct
                   operation at next invoke */
                sftp->packet_state = (rc == LIBSSH2_ERROR_EAGAIN) ?
                    libssh2_NB_state_sent :
                    libssh2_NB_state_idle;

                if(rc == LIBSSH2_ERROR_EAGAIN)
                    return (int)rc;
            }
        }

        /* Read as much of the packet as we can */
        while(sftp->partial_len > sftp->partial_received) {
            rc = _libssh2_channel_read(channel, 0,
                                       (char *)&packet[sftp->partial_received],
                                       sftp->partial_len -
                                       sftp->partial_received);

            if(rc == LIBSSH2_ERROR_EAGAIN) {
                /*
                 * We received EAGAIN, save what we have and return EAGAIN to
                 * the caller. Set 'partial_packet' so that this function
                 * knows how to continue on the next invoke.
                 */
                sftp->packet_state = libssh2_NB_state_sent1;
                return (int)rc;
            }
            else if(rc < 0) {
                LIBSSH2_FREE(session, packet);
                sftp->partial_packet = NULL;
                return _libssh2_error(session, (int)rc,
                                      "Error waiting for SFTP packet");
            }
            sftp->partial_received += rc;
        }

        sftp->partial_packet = NULL;

        /* sftp_packet_add takes ownership of the packet and might free it
           so we take a copy of the packet type before we call it. */
        packet_type = packet[0];
        rc = sftp_packet_add(sftp, packet, sftp->partial_len);
        if(rc) {
            LIBSSH2_FREE(session, packet);
            return (int)rc;
        }
        else {
            return packet_type;
        }
    }
    /* WON'T REACH */
}